

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O0

Config * jaegertracing::Config::parse(Config *__return_storage_ptr__,Node *configYAML)

{
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *this;
  byte bVar1;
  bool bVar2;
  char (*in_R8) [1];
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_4c8;
  undefined1 local_4b0 [8];
  RestrictionsConfig baggageRestrictions;
  Node baggageRestrictionsNode;
  HeadersConfig headers;
  Node headersNode;
  Config reporter;
  Node reporterNode;
  Config sampler;
  Node samplerNode;
  undefined1 local_2c8 [7];
  bool disabled;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> serviceName;
  allocator local_289;
  string local_288;
  duration local_268;
  allocator local_259;
  string local_258;
  RestrictionsConfig local_238;
  HeadersConfig local_208;
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  duration local_138;
  Config local_130;
  duration local_d8;
  allocator local_c9;
  string local_c8;
  allocator local_91;
  string local_90;
  Config local_70;
  Node *local_18;
  Node *configYAML_local;
  
  local_18 = configYAML;
  configYAML_local = (Node *)__return_storage_ptr__;
  bVar2 = YAML::Node::IsDefined(configYAML);
  if ((bVar2) && (bVar2 = YAML::Node::IsMap(local_18), bVar2)) {
    utils::yaml::findOrDefault<std::__cxx11::string,char[13],char[1]>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8,
               (yaml *)local_18,(Node *)"service_name",(char (*) [13])0x34afcb,in_R8);
    samplerNode.m_pNode._6_1_ = 0;
    samplerNode.m_pNode._7_1_ =
         utils::yaml::findOrDefault<bool,char[9],bool>
                   (local_18,(char (*) [9])"disabled",(bool *)((long)&samplerNode.m_pNode + 6));
    YAML::Node::operator[]<char[8]>
              ((Node *)&sampler._samplingRefreshInterval,local_18,(char (*) [8])0x340034);
    samplers::Config::parse
              ((Config *)&reporterNode.m_pNode,(Node *)&sampler._samplingRefreshInterval);
    YAML::Node::operator[]<char[9]>
              ((Node *)((long)&reporter._endpoint.field_2 + 8),local_18,(char (*) [9])"reporter");
    reporters::Config::parse
              ((Config *)&headersNode.m_pNode,(Node *)((long)&reporter._endpoint.field_2 + 8));
    YAML::Node::operator[]<char[8]>
              ((Node *)((long)&headers._traceBaggageHeaderPrefix.field_2 + 8),local_18,
               (char (*) [8])"headers");
    propagation::HeadersConfig::parse
              ((HeadersConfig *)&baggageRestrictionsNode.m_pNode,
               (Node *)((long)&headers._traceBaggageHeaderPrefix.field_2 + 8));
    YAML::Node::operator[]<char[21]>
              ((Node *)&baggageRestrictions._refreshInterval,local_18,
               (char (*) [21])"baggage_restrictions");
    baggage::RestrictionsConfig::parse
              ((RestrictionsConfig *)local_4b0,(Node *)&baggageRestrictions._refreshInterval);
    bVar1 = samplerNode.m_pNode._7_1_;
    local_4c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector(&local_4c8);
    Config(__return_storage_ptr__,(bool)(bVar1 & 1),(Config *)&reporterNode.m_pNode,
           (Config *)&headersNode.m_pNode,(HeadersConfig *)&baggageRestrictionsNode.m_pNode,
           (RestrictionsConfig *)local_4b0,(string *)local_2c8,&local_4c8);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_4c8);
    baggage::RestrictionsConfig::~RestrictionsConfig((RestrictionsConfig *)local_4b0);
    YAML::Node::~Node((Node *)&baggageRestrictions._refreshInterval);
    propagation::HeadersConfig::~HeadersConfig((HeadersConfig *)&baggageRestrictionsNode.m_pNode);
    YAML::Node::~Node((Node *)((long)&headers._traceBaggageHeaderPrefix.field_2 + 8));
    reporters::Config::~Config((Config *)&headersNode.m_pNode);
    YAML::Node::~Node((Node *)((long)&reporter._endpoint.field_2 + 8));
    samplers::Config::~Config((Config *)&reporterNode.m_pNode);
    YAML::Node::~Node((Node *)&sampler._samplingRefreshInterval);
    std::__cxx11::string::~string((string *)local_2c8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,"remote",&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"http://127.0.0.1:5778/sampling",&local_c9);
    local_d8 = samplers::Config::defaultSamplingRefreshInterval();
    samplers::Config::Config(&local_70,&local_90,0.001,&local_c8,2000,&local_d8);
    local_138 = reporters::Config::defaultBufferFlushInterval();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_158,"127.0.0.1:6831",&local_159);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_180,"",&local_181);
    reporters::Config::Config(&local_130,100,&local_138,false,&local_158,&local_180);
    propagation::HeadersConfig::HeadersConfig(&local_208);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_258,"",&local_259);
    local_268.__r = 0;
    baggage::RestrictionsConfig::RestrictionsConfig(&local_238,false,&local_258,&local_268);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_288,"",&local_289);
    serviceName.field_2._8_8_ = 0;
    this = (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)
           ((long)&serviceName.field_2 + 8);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector(this);
    Config(__return_storage_ptr__,false,&local_70,&local_130,&local_208,&local_238,&local_288,this);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
              ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)
               ((long)&serviceName.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    baggage::RestrictionsConfig::~RestrictionsConfig(&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator((allocator<char> *)&local_259);
    propagation::HeadersConfig::~HeadersConfig(&local_208);
    reporters::Config::~Config(&local_130);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    samplers::Config::~Config(&local_70);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  return __return_storage_ptr__;
}

Assistant:

static Config parse(const YAML::Node& configYAML)
    {
        if (!configYAML.IsDefined() || !configYAML.IsMap()) {
            return Config();
        }

        const auto serviceName =
            utils::yaml::findOrDefault<std::string>(configYAML, "service_name", "");

        const auto disabled =
            utils::yaml::findOrDefault<bool>(configYAML, "disabled", false);
        const auto samplerNode = configYAML["sampler"];
        const auto sampler = samplers::Config::parse(samplerNode);
        const auto reporterNode = configYAML["reporter"];
        const auto reporter = reporters::Config::parse(reporterNode);
        const auto headersNode = configYAML["headers"];
        const auto headers = propagation::HeadersConfig::parse(headersNode);
        const auto baggageRestrictionsNode = configYAML["baggage_restrictions"];
        const auto baggageRestrictions =
            baggage::RestrictionsConfig::parse(baggageRestrictionsNode);
        return Config(
            disabled, sampler, reporter, headers, baggageRestrictions, serviceName);
    }